

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  TargetType tgtType;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  cmMessenger *messenger;
  ostream *poVar6;
  cmGlobalGenerator *this_00;
  char *__s;
  char *value_local;
  string local_1c0;
  ostringstream e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [46];
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  tgtType = (_Var1._M_head_impl)->TargetType;
  value_local = value;
  messenger = cmMakefile::GetMessenger((_Var1._M_head_impl)->Makefile);
  cmMakefile::GetBacktrace((cmMakefile *)&e);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
  if (!bVar3) {
    return;
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propCUDA_PTX_COMPILATION_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propCUDA_PTX_COMPILATION_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propCUDA_PTX_COMPILATION_abi_cxx11_,"CUDA_PTX_COMPILATION",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propCUDA_PTX_COMPILATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propCUDA_PTX_COMPILATION_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propEXPORT_NAME_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
               "EXPORT_NAME",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propEXPORT_NAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propEXPORT_NAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propIMPORTED_GLOBAL_abi_cxx11_
               ,"IMPORTED_GLOBAL",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propIMPORTED_GLOBAL_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_OPTIONS_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_DIRECTORIES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                         propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propLINK_DIRECTORIES_abi_cxx11_,"LINK_DIRECTORIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::
       propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::
                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,"MANUALLY_ADDED_DEPENDENCIES",
               (allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propNAME_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
               "NAME",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propNAME_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propSOURCES_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
               "SOURCES",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::
                         propSOURCES_abi_cxx11_);
  }
  if ((SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProperty(std::__cxx11::string_const&,char_const*)::
                                   propTYPE_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
               "TYPE",(allocator<char> *)&e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SetProperty(std::__cxx11::string_const&,char_const*)::propTYPE_abi_cxx11_);
  }
  _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  if (_Var4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
  }
  else {
    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                  propNAME_abi_cxx11_);
    if (_Var4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"NAME property is read-only\n");
      pcVar2 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
    }
    else {
      _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                    propTYPE_abi_cxx11_);
      if (_Var4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"TYPE property is read-only\n");
        pcVar2 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
      }
      else {
        _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                      propEXPORT_NAME_abi_cxx11_);
        if ((_Var4) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar6 = std::operator<<((ostream *)&e,
                                   "EXPORT_NAME property can\'t be set on imported targets (\"");
          poVar6 = std::operator<<(poVar6,(string *)
                                          &((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Name);
          std::operator<<(poVar6,"\")\n");
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
        }
        else {
          _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                        propSOURCES_abi_cxx11_);
          if ((_Var4) &&
             (((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
              true)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar6 = std::operator<<((ostream *)&e,
                                     "SOURCES property can\'t be set on imported targets (\"");
            poVar6 = std::operator<<(poVar6,(string *)
                                            &((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Name);
            std::operator<<(poVar6,"\")\n");
            pcVar2 = ((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
          }
          else {
            _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                          propIMPORTED_GLOBAL_abi_cxx11_);
            if ((!_Var4) ||
               (((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget
                != false)) {
              _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                            propINCLUDE_DIRECTORIES_abi_cxx11_);
              if (_Var4) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(&((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                         IncludeDirectoriesEntries);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            IncludeDirectoriesBacktraces);
                if (value_local == (char *)0x0) {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            IncludeDirectoriesEntries,&value_local);
                cmMakefile::GetBacktrace((cmMakefile *)&e);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            IncludeDirectoriesBacktraces,(value_type *)&e);
              }
              else {
                _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)::
                                              propCOMPILE_OPTIONS_abi_cxx11_);
                if (_Var4) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           CompileOptionsEntries);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                            (&((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileOptionsBacktraces);
                  if (value_local == (char *)0x0) {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileOptionsEntries,&value_local);
                  cmMakefile::GetBacktrace((cmMakefile *)&e);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileOptionsBacktraces,(value_type *)&e);
                }
                else {
                  _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                ::propCOMPILE_FEATURES_abi_cxx11_);
                  if (_Var4) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::clear(&((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             CompileFeaturesEntries);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                              (&((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                CompileFeaturesBacktraces);
                    if (value_local == (char *)0x0) {
                      return;
                    }
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                CompileFeaturesEntries,&value_local);
                    cmMakefile::GetBacktrace((cmMakefile *)&e);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               CompileFeaturesBacktraces,(value_type *)&e);
                  }
                  else {
                    _Var4 = std::operator==(prop,&SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCOMPILE_DEFINITIONS_abi_cxx11_);
                    if (_Var4) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               CompileDefinitionsEntries);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                                (&((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->CompileDefinitionsBacktraces);
                      if (value_local == (char *)0x0) {
                        return;
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->CompileDefinitionsEntries,&value_local);
                      cmMakefile::GetBacktrace((cmMakefile *)&e);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 CompileDefinitionsBacktraces,(value_type *)&e);
                    }
                    else {
                      _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_OPTIONS_abi_cxx11_);
                      if (_Var4) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 LinkOptionsEntries);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        clear(&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               LinkOptionsBacktraces);
                        if (value_local == (char *)0x0) {
                          return;
                        }
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->LinkOptionsEntries,&value_local);
                        cmMakefile::GetBacktrace((cmMakefile *)&e);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkOptionsBacktraces,(value_type *)&e);
                      }
                      else {
                        _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_DIRECTORIES_abi_cxx11_);
                        if (_Var4) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::clear(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkDirectoriesEntries);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          clear(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 LinkDirectoriesBacktraces);
                          if (value_local == (char *)0x0) {
                            return;
                          }
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&((this->impl)._M_t.
                                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                          .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl)->LinkDirectoriesEntries,&value_local);
                          cmMakefile::GetBacktrace((cmMakefile *)&e);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->LinkDirectoriesBacktraces,(value_type *)&e);
                        }
                        else {
                          _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propLINK_LIBRARIES_abi_cxx11_);
                          if (_Var4) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->LinkImplementationPropertyEntries);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkImplementationPropertyBacktraces);
                            if (value_local == (char *)0x0) {
                              return;
                            }
                            cmMakefile::GetBacktrace((cmMakefile *)&e);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->LinkImplementationPropertyEntries,
                                       &value_local);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->LinkImplementationPropertyBacktraces,
                                      (value_type *)&e);
                          }
                          else {
                            _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propSOURCES_abi_cxx11_);
                            if (!_Var4) {
                              _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propIMPORTED_GLOBAL_abi_cxx11_);
                              if (_Var4) {
                                bVar3 = cmSystemTools::IsOn(value_local);
                                if (bVar3) {
                                  _Var1._M_head_impl =
                                       (this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl;
                                  if ((_Var1._M_head_impl)->ImportedGloballyVisible != false) {
                                    return;
                                  }
                                  (_Var1._M_head_impl)->ImportedGloballyVisible = true;
                                  this_00 = GetGlobalGenerator(this);
                                  cmGlobalGenerator::IndexTarget(this_00,this);
                                  return;
                                }
                                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                                poVar6 = std::operator<<((ostream *)&e,
                                                                                                                  
                                                  "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\""
                                                  );
                                poVar6 = std::operator<<(poVar6,(string *)
                                                                &((this->impl)._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>
                                                  ._M_head_impl)->Name);
                                std::operator<<(poVar6,"\")\n");
                                pcVar2 = ((this->impl)._M_t.
                                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                          .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl)->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
                              }
                              else {
                                bVar3 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                                  (prop,(char (*) [17])"IMPORTED_LIBNAME");
                                if (bVar3) {
                                  _Var1._M_head_impl =
                                       (this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl;
                                  __s = "";
                                  if (value_local != (char *)0x0) {
                                    __s = value_local;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&e,__s,(allocator<char> *)&local_1c0);
                                  bVar3 = cmTargetInternals::CheckImportedLibName
                                                    (_Var1._M_head_impl,prop,(string *)&e);
                                  std::__cxx11::string::~string((string *)&e);
                                  if (!bVar3) {
                                    return;
                                  }
                                }
                                _Var4 = std::operator==(prop,&
                                                  SetProperty(std::__cxx11::string_const&,char_const*)
                                                  ::propCUDA_PTX_COMPILATION_abi_cxx11_);
                                _Var1._M_head_impl =
                                     (this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                ;
                                if ((!_Var4) || ((_Var1._M_head_impl)->TargetType == 4)) {
                                  cmPropertyMap::SetProperty
                                            (&(_Var1._M_head_impl)->Properties,prop,value_local);
                                  return;
                                }
                                std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                                poVar6 = std::operator<<((ostream *)&e,
                                                                                                                  
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                                poVar6 = std::operator<<(poVar6,(string *)
                                                                &((this->impl)._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>
                                                  ._M_head_impl)->Name);
                                std::operator<<(poVar6,"\")\n");
                                pcVar2 = ((this->impl)._M_t.
                                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                          .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl)->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
                              }
                              goto LAB_0021cd03;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::clear(&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->SourceEntries);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            clear(&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->SourceBacktraces);
                            if (value_local == (char *)0x0) {
                              return;
                            }
                            cmMakefile::GetBacktrace((cmMakefile *)&e);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->SourceEntries,&value_local);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->SourceBacktraces,(value_type *)&e);
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
              return;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar6 = std::operator<<((ostream *)&e,
                                     "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                    );
            poVar6 = std::operator<<(poVar6,(string *)
                                            &((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Name);
            std::operator<<(poVar6,"\")\n");
            pcVar2 = ((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1c0);
          }
        }
      }
    }
  }
LAB_0021cd03:
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, impl->Makefile->GetMessenger(),
        impl->Makefile->GetBacktrace())) {
    return;
  }
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(CUDA_PTX_COMPILATION);
  MAKE_STATIC_PROP(EXPORT_NAME);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
  MAKE_STATIC_PROP(TYPE);
#undef MAKE_STATIC_PROP
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    std::ostringstream e;
    e << "MANUALLY_ADDED_DEPENDENCIES property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propNAME) {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propTYPE) {
    std::ostringstream e;
    e << "TYPE property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << impl->Name
      << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    impl->IncludeDirectoriesEntries.clear();
    impl->IncludeDirectoriesBacktraces.clear();
    if (value) {
      impl->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    impl->CompileOptionsEntries.clear();
    impl->CompileOptionsBacktraces.clear();
    if (value) {
      impl->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    impl->CompileFeaturesEntries.clear();
    impl->CompileFeaturesBacktraces.clear();
    if (value) {
      impl->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    impl->CompileDefinitionsEntries.clear();
    impl->CompileDefinitionsBacktraces.clear();
    if (value) {
      impl->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    impl->LinkOptionsEntries.clear();
    impl->LinkOptionsBacktraces.clear();
    if (value) {
      impl->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    impl->LinkDirectoriesEntries.clear();
    impl->LinkDirectoriesBacktraces.clear();
    if (value) {
      impl->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    impl->LinkImplementationPropertyEntries.clear();
    impl->LinkImplementationPropertyBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkImplementationPropertyEntries.emplace_back(value);
      impl->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == propSOURCES) {
    impl->SourceEntries.clear();
    impl->SourceBacktraces.clear();
    if (value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->SourceEntries.emplace_back(value);
      impl->SourceBacktraces.push_back(lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmSystemTools::IsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << impl->Name << "\")\n";
      impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!impl->ImportedGloballyVisible) {
      impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !impl->CheckImportedLibName(prop, value ? value : "")) {
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else {
    impl->Properties.SetProperty(prop, value);
  }
}